

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathFreeCompExpr(xmlXPathCompExprPtr comp)

{
  xmlXPathObjectPtr pxVar1;
  xmlXPathStepOp *pxVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  if (comp != (xmlXPathCompExprPtr)0x0) {
    if (comp->dict == (xmlDictPtr)0x0) {
      if (0 < comp->nbStep) {
        lVar4 = 0x20;
        lVar5 = 0;
        do {
          pxVar2 = comp->steps;
          pxVar1 = *(xmlXPathObjectPtr *)((long)pxVar2 + lVar4 + -8);
          if (pxVar1 != (xmlXPathObjectPtr)0x0) {
            if (*(int *)((long)pxVar2 + lVar4 + -0x20) == 0xb) {
              xmlXPathFreeObject(pxVar1);
            }
            else {
              (*xmlFree)(pxVar1);
            }
          }
          pvVar3 = *(void **)((long)&pxVar2->op + lVar4);
          if (pvVar3 != (void *)0x0) {
            (*xmlFree)(pvVar3);
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x38;
        } while (lVar5 < comp->nbStep);
      }
    }
    else {
      if (0 < comp->nbStep) {
        lVar4 = 0;
        lVar5 = 0;
        do {
          pxVar1 = *(xmlXPathObjectPtr *)((long)&comp->steps->value4 + lVar4);
          if ((pxVar1 != (xmlXPathObjectPtr)0x0) &&
             (*(int *)((long)&comp->steps->op + lVar4) == 0xb)) {
            xmlXPathFreeObject(pxVar1);
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x38;
        } while (lVar5 < comp->nbStep);
      }
      xmlDictFree(comp->dict);
    }
    if (comp->steps != (xmlXPathStepOp *)0x0) {
      (*xmlFree)(comp->steps);
    }
    if (comp->expr != (xmlChar *)0x0) {
      (*xmlFree)(comp->expr);
    }
    (*xmlFree)(comp);
    return;
  }
  return;
}

Assistant:

void
xmlXPathFreeCompExpr(xmlXPathCompExprPtr comp)
{
    xmlXPathStepOpPtr op;
    int i;

    if (comp == NULL)
        return;
    if (comp->dict == NULL) {
	for (i = 0; i < comp->nbStep; i++) {
	    op = &comp->steps[i];
	    if (op->value4 != NULL) {
		if (op->op == XPATH_OP_VALUE)
		    xmlXPathFreeObject(op->value4);
		else
		    xmlFree(op->value4);
	    }
	    if (op->value5 != NULL)
		xmlFree(op->value5);
	}
    } else {
	for (i = 0; i < comp->nbStep; i++) {
	    op = &comp->steps[i];
	    if (op->value4 != NULL) {
		if (op->op == XPATH_OP_VALUE)
		    xmlXPathFreeObject(op->value4);
	    }
	}
        xmlDictFree(comp->dict);
    }
    if (comp->steps != NULL) {
        xmlFree(comp->steps);
    }
#ifdef XPATH_STREAMING
    if (comp->stream != NULL) {
        xmlFreePatternList(comp->stream);
    }
#endif
    if (comp->expr != NULL) {
        xmlFree(comp->expr);
    }

    xmlFree(comp);
}